

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O2

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_60<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_60<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>_>
         *this)

{
  CATCH2_INTERNAL_TEMPLATE_TEST_60<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
  obj;
  
  anon_unknown.dwarf_965823::Constructable::reset();
  obj.super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>.
  theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.data_ =
       (pointer)obj.
                super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
                .theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.firstElement;
  obj.super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>.
  theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.len = 0;
  obj.super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>.
  theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.cap = 9;
  obj.super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>.
  otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.data_ =
       (pointer)obj.
                super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
                .otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.
                firstElement;
  obj.super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>.
  otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.len = 0;
  obj.super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>.
  otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.cap = 9;
  (*(code *)this->m_testAsMethod)
            (obj.
             super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>.
             theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.firstElement +
             *(long *)&this->field_0x10 + -0x18);
  anon_unknown.dwarf_965823::
  SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>::~SmallVectorTest
            (&obj.
              super_SmallVectorTest<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>)
  ;
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }